

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O2

bool __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::normalize
          (miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *this)

{
  spectrum *lspec;
  bool bVar1;
  spectral_operation sVar2;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var3;
  uint i;
  uint uVar4;
  __hashtable *__h;
  ulong local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  _Var3 = std::
          __max_element<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_comp_iter<kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4u,true>>::normalize()::_lambda(auto:1,auto:2)_1_>>
                    ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )(this->order).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )(this->order).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_msoeken[P]kitty_include_kitty_spectral_hpp:489:63)>
                      )this);
  uVar4 = *_Var3._M_current;
  if (uVar4 != 0) {
    i = -uVar4 & uVar4;
    for (uVar4 = uVar4 ^ i; uVar4 != 0; uVar4 = uVar4 ^ -uVar4 & uVar4) {
      sVar2 = spectrum::spectral_translation(&this->spec,i,-uVar4 & uVar4);
      local_50 = CONCAT26(local_50._6_2_,sVar2);
      insert(this,(spectral_operation *)&local_50);
    }
    if (this->hasDisjointTranslation == true) {
      sVar2 = spectrum::disjoint_translation(&this->spec,i);
      local_50 = CONCAT26(local_50._6_2_,sVar2);
      insert(this,(spectral_operation *)&local_50);
    }
  }
  lspec = &this->spec;
  for (uVar4 = 1; uVar4 <= this->num_vars_exp; uVar4 = uVar4 * 2) {
    local_50 = (ulong)uVar4;
    spectrum::spectrum((spectrum *)&local_48,lspec);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,kitty::detail::spectrum>,std::allocator<std::pair<unsigned_long_const,kitty::detail::spectrum>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_long_const,kitty::detail::spectrum>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,kitty::detail::spectrum>,std::allocator<std::pair<unsigned_long_const,kitty::detail::spectrum>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->specs,&local_50);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  }
  update_best(this,lspec);
  bVar1 = normalize_rec(this,lspec,1);
  std::vector<int,_std::allocator<int>_>::operator=(&lspec->_s,&(this->best_spec)._s);
  return bVar1;
}

Assistant:

bool normalize()
  {
    /* find maximum absolute element index in spectrum (by order) */
    auto j = *std::max_element( order.cbegin(), order.cend(), [this]( auto p1, auto p2 )
                                { return abs( spec[p1] ) < abs( spec[p2] ); } );

    /* if max element is not the first element */
    if ( j )
    {
      auto k = j - ( j & ( j - 1 ) ); /* LSB of j */
      j ^= k;                         /* delete bit in j */

      while ( j )
      {
        auto p = j - ( j & ( j - 1 ) ); /* next LSB of j */
        j ^= p;                         /* delete bit in j */
        insert( spec.spectral_translation( k, p ) );
      }
      if ( hasDisjointTranslation )
      {
        insert( spec.disjoint_translation( k ) );
      }
    }

    for ( auto v = 1u; v <= num_vars_exp; v <<= 1 )
    {
      specs.insert( { v, spec } );
    }

    update_best( spec );
    const auto result = normalize_rec( spec, 1 );
    spec = best_spec;
    return result;
  }